

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

SHADER_RESOURCE_TYPE Diligent::SPIRVShaderResourceAttribs::GetShaderResourceType(ResourceType Type)

{
  undefined *puVar1;
  undefined8 uVar2;
  Char *Message;
  undefined1 local_60 [8];
  string msg;
  undefined1 local_30 [8];
  string _msg;
  ResourceType Type_local;
  
  _msg.field_2._M_local_buf[0xe] = Type;
  switch(Type) {
  case UniformBuffer:
    _msg.field_2._M_local_buf[0xf] = '\x01';
    break;
  case ROStorageBuffer:
    _msg.field_2._M_local_buf[0xf] = '\x03';
    break;
  case RWStorageBuffer:
    _msg.field_2._M_local_buf[0xf] = '\x05';
    break;
  case UniformTexelBuffer:
    _msg.field_2._M_local_buf[0xf] = '\x03';
    break;
  case StorageTexelBuffer:
    _msg.field_2._M_local_buf[0xf] = '\x05';
    break;
  case StorageImage:
    _msg.field_2._M_local_buf[0xf] = '\x04';
    break;
  case SampledImage:
    _msg.field_2._M_local_buf[0xf] = '\x02';
    break;
  case AtomicCounter:
    FormatString<char[64]>
              ((string *)local_30,
               (char (*) [64])"There is no appropriate shader resource type for atomic counter");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_30);
    _msg.field_2._M_local_buf[0xf] = '\x05';
    break;
  case SeparateImage:
    _msg.field_2._M_local_buf[0xf] = '\x02';
    break;
  case SeparateSampler:
    _msg.field_2._M_local_buf[0xf] = '\x06';
    break;
  case InputAttachment:
    _msg.field_2._M_local_buf[0xf] = '\a';
    break;
  case AccelerationStructure:
    _msg.field_2._M_local_buf[0xf] = '\b';
    break;
  default:
    FormatString<char[28]>((string *)local_60,(char (*) [28])"Unknown SPIRV resource type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderResourceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0xae);
    std::__cxx11::string::~string((string *)local_60);
    _msg.field_2._M_local_buf[0xf] = '\0';
  }
  return _msg.field_2._M_local_buf[0xf];
}

Assistant:

SHADER_RESOURCE_TYPE SPIRVShaderResourceAttribs::GetShaderResourceType(ResourceType Type)
{
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please handle the new resource type below");
    switch (Type)
    {
        case SPIRVShaderResourceAttribs::ResourceType::UniformBuffer:
            return SHADER_RESOURCE_TYPE_CONSTANT_BUFFER;

        case SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer:
            // Read-only storage buffers map to buffer SRV
            // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide#read-write-vs-read-only-resources-for-hlsl
            return SHADER_RESOURCE_TYPE_BUFFER_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::StorageImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::SampledImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::AtomicCounter:
            LOG_WARNING_MESSAGE("There is no appropriate shader resource type for atomic counter");
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::SeparateImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::SeparateSampler:
            return SHADER_RESOURCE_TYPE_SAMPLER;

        case SPIRVShaderResourceAttribs::ResourceType::InputAttachment:
            return SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;

        case SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure:
            return SHADER_RESOURCE_TYPE_ACCEL_STRUCT;

        default:
            UNEXPECTED("Unknown SPIRV resource type");
            return SHADER_RESOURCE_TYPE_UNKNOWN;
    }
}